

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall booster::callback<int()>::callback<int(*)()>(callback<int_()> *this,_func_int *func)

{
  callable<int_()> *p;
  callable_impl<int,_int_(*)()> *in_RDI;
  _func_int *in_stack_ffffffffffffffc8;
  intrusive_ptr<booster::callable<int_()>_> *in_stack_ffffffffffffffe0;
  
  p = (callable<int_()> *)operator_new(0x18);
  callback<int_()>::callable_impl<int,_int_(*)()>::callable_impl(in_RDI,in_stack_ffffffffffffffc8);
  intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}